

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

string * __thiscall
Game::(anonymous_namespace)::drawEndGameLoopGraphics_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          current_game_session_t *finalgamestatus)

{
  _anonymous_namespace_ _Var1;
  _anonymous_namespace_ *this_00;
  ulong uVar2;
  GameBoard *in_R8;
  __tuple_element_t<3UL,_tuple<unsigned_long_long,_bool,_array<bool,_8UL>,_GameBoard>_> gb;
  scoreboard_display_data_t scdd;
  ostringstream str_os;
  GameBoard local_3f0;
  anon_class_16_2_1b05ec1b local_3b0;
  GameBoard local_3a0;
  GameBoard local_360;
  anon_class_72_2_1b079f8f local_320;
  _Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  _Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  anon_class_112_2_1b08a655 local_208;
  ostringstream local_198 [376];
  
  this_00 = *(_anonymous_namespace_ **)(this + 0x50);
  _Var1 = this[0x48];
  GameBoard::GameBoard(&local_3f0,(GameBoard *)this);
  uVar2 = *(ulong *)(this + 0x40);
  std::__cxx11::ostringstream::ostringstream(local_198);
  clearScreen();
  DrawAlways<std::__cxx11::string(*)()>((ostream *)local_198,Graphics::AsciiArt2048_abi_cxx11_);
  GameBoard::GameBoard(&local_360,&local_3f0);
  make_scoreboard_display_data_abi_cxx11_
            ((scoreboard_display_data_t *)&local_270,this_00,(ulong)(byte)_Var1,SUB81(&local_360,0),
             in_R8);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_360);
  std::
  _Tuple_impl<0UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Tuple_impl(&local_2d8,&local_270);
  DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>
            (&local_208,
             (tuple<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2d8,Graphics::GameScoreBoardOverlay);
  DrawAlways<DataSuppliment<std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<bool,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>))::_lambda()_1_>
            ((ostream *)local_198,&local_208);
  std::
  _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208);
  std::
  _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl(&local_2d8.
                  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  GameBoard::GameBoard(&local_3a0,&local_3f0);
  DataSuppliment<Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard)>
            (&local_320,&local_3a0,Gameboard::Graphics::GameBoardTextOutput_abi_cxx11_);
  DrawAlways<DataSuppliment<Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard)>(Game::GameBoard,std::__cxx11::string(*)(Game::GameBoard))::_lambda()_1_>
            ((ostream *)local_198,&local_320);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_320);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_3a0);
  local_3b0._0_8_ = (ulong)(((uint)uVar2 & 0xff) << 8) | uVar2 >> 0x28 & 0xff;
  local_3b0.f = Graphics::GameEndScreenOverlay_abi_cxx11_;
  DrawAlways<DataSuppliment<std::tuple<bool,bool>,std::__cxx11::string(*)(std::tuple<bool,bool>)>(std::tuple<bool,bool>,std::__cxx11::string(*)(std::tuple<bool,bool>))::_lambda()_1_>
            ((ostream *)local_198,&local_3b0);
  std::__cxx11::stringbuf::str();
  std::
  _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl(&local_270.
                  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>::~_Vector_base
            ((_Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_3f0);
  return __return_storage_ptr__;
}

Assistant:

std::string drawEndGameLoopGraphics(current_game_session_t finalgamestatus) {
  // Graphical Output has a specific ordering...
  using namespace Graphics;
  using namespace Gameboard::Graphics;
  using tup_idx = tuple_cgs_t_idx;
  const auto bestScore = std::get<tup_idx::IDX_BESTSCORE>(finalgamestatus);
  const auto comp_mode = std::get<tup_idx::IDX_COMP_MODE>(finalgamestatus);
  const auto gb = std::get<tup_idx::IDX_GAMEBOARD>(finalgamestatus);
  const auto end_gamestatus =
      std::get<tup_idx::IDX_GAMESTATUS>(finalgamestatus);

  std::ostringstream str_os;

  // 1. Clear screen
  clearScreen();

  // 2. Draw Game Title Art
  DrawAlways(str_os, AsciiArt2048);

  // 3. Draw Scoreboard of ending current game session
  const auto scdd = make_scoreboard_display_data(bestScore, comp_mode, gb);
  DrawAlways(str_os, DataSuppliment(scdd, GameScoreBoardOverlay));

  // 4. Draw snapshot of ending 2048 session's gameboard
  DrawAlways(str_os, DataSuppliment(gb, GameBoardTextOutput));

  // 5. Draw "You win!" or "You Lose" prompt, only if not in endless mode.
  const auto esdd = make_end_screen_display_data(end_gamestatus);
  DrawAlways(str_os, DataSuppliment(esdd, GameEndScreenOverlay));

  return str_os.str();
}